

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall
Imf_3_2::Image::resize
          (Image *this,Box2i *dataWindow,LevelMode levelMode,LevelRoundingMode levelRoundingMode)

{
  bool bVar1;
  ImageLevel **ppIVar2;
  pointer ppVar3;
  pointer ppVar4;
  undefined4 in_ECX;
  int in_EDX;
  long *in_RDI;
  iterator i;
  Box2i levelDataWindow;
  int x;
  int y;
  int ny;
  int nx;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff48;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  ImageLevel *pIVar5;
  Box2i *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  PixelType PVar6;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff74;
  uint uVar8;
  ImageLevel **in_stack_ffffffffffffff78;
  ImageLevel **in_stack_ffffffffffffff80;
  ImageLevel *in_stack_ffffffffffffff88;
  Image *in_stack_ffffffffffffff90;
  _Self local_58;
  Box<Imath_3_2::Vec2<int>_> local_50;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  undefined4 local_18;
  int local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  clearLevels(in_stack_ffffffffffffff90);
  local_28 = anon_unknown_8::computeNumXLevels
                       (in_stack_ffffffffffffff60,
                        (LevelMode)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                        (LevelRoundingMode)in_stack_ffffffffffffff58);
  local_2c = anon_unknown_8::computeNumYLevels
                       (in_stack_ffffffffffffff60,
                        (LevelMode)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                        (LevelRoundingMode)in_stack_ffffffffffffff58);
  Array2D<Imf_3_2::ImageLevel_*>::resizeErase
            ((Array2D<Imf_3_2::ImageLevel_*> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (long)in_stack_ffffffffffffff60);
  for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
      if ((local_14 == 1) && (local_34 != local_30)) {
        ppIVar2 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                            ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 10),(long)local_30);
        ppIVar2[local_34] = (ImageLevel *)0x0;
      }
      else {
        anon_unknown_8::computeDataWindowForLevel
                  ((Box2i *)in_stack_ffffffffffffff88,
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                   (LevelRoundingMode)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        in_stack_ffffffffffffff88 =
             (ImageLevel *)(**(code **)(*in_RDI + 0x38))(in_RDI,local_34,local_30,&local_50.max.y);
        in_stack_ffffffffffffff80 =
             Array2D<Imf_3_2::ImageLevel_*>::operator[]
                       ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 10),(long)local_30);
        in_stack_ffffffffffffff80[local_34] = in_stack_ffffffffffffff88;
        local_50.min = (Vec2<int>)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
                       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
                                *)in_stack_ffffffffffffff48);
        while( true ) {
          local_58._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
                      *)in_stack_ffffffffffffff48);
          bVar1 = std::operator!=((_Self *)&local_50,&local_58);
          if (!bVar1) break;
          in_stack_ffffffffffffff78 =
               Array2D<Imf_3_2::ImageLevel_*>::operator[]
                         ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 10),(long)local_30);
          pIVar5 = in_stack_ffffffffffffff78[local_34];
          in_stack_ffffffffffffff50 = &local_50;
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                                 *)0x1324bc);
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                                 *)0x1324cb);
          PVar6 = (ppVar4->second).type;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                                 *)0x1324dc);
          uVar7 = (ppVar4->second).xSampling;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                                 *)0x1324ed);
          uVar8 = (ppVar4->second).ySampling;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                                 *)0x1324fe);
          (*pIVar5->_vptr_ImageLevel[4])
                    (pIVar5,ppVar3,(ulong)PVar6,(ulong)uVar7,(ulong)uVar8,
                     (ulong)((ppVar4->second).pLinear & 1));
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                        *)in_stack_ffffffffffffff50);
        }
      }
    }
  }
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  *(int *)(in_RDI + 3) = local_14;
  *(undefined4 *)((long)in_RDI + 0x1c) = local_18;
  return;
}

Assistant:

void
Image::resize (
    const Box2i&      dataWindow,
    LevelMode         levelMode,
    LevelRoundingMode levelRoundingMode)
{
    try
    {
        clearLevels ();

        int nx = computeNumXLevels (dataWindow, levelMode, levelRoundingMode);
        int ny = computeNumYLevels (dataWindow, levelMode, levelRoundingMode);

        _levels.resizeErase (ny, nx);

        for (int y = 0; y < ny; ++y)
        {
            for (int x = 0; x < nx; ++x)
            {
                if (levelMode == MIPMAP_LEVELS && x != y)
                {
                    _levels[y][x] = 0;
                    continue;
                }

                Box2i levelDataWindow = computeDataWindowForLevel (
                    dataWindow, x, y, levelRoundingMode);

                _levels[y][x] = newLevel (x, y, levelDataWindow);

                for (ChannelMap::iterator i = _channels.begin ();
                     i != _channels.end ();
                     ++i)
                {
                    _levels[y][x]->insertChannel (
                        i->first,
                        i->second.type,
                        i->second.xSampling,
                        i->second.ySampling,
                        i->second.pLinear);
                }
            }
        }

        _dataWindow        = dataWindow;
        _levelMode         = levelMode;
        _levelRoundingMode = levelRoundingMode;
    }
    catch (...)
    {
        clearLevels ();
        throw;
    }
}